

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerInvulnerable::InitEffect(APowerInvulnerable *this)

{
  bool bVar1;
  AActor *pAVar2;
  MetaClass *pMVar3;
  APowerInvulnerable *this_local;
  
  APowerup::InitEffect(&this->super_APowerup);
  pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  pAVar2->effects = pAVar2->effects & 0xffffffdf;
  pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  TFlags<ActorFlag2,_unsigned_int>::operator|=(&pAVar2->flags2,MF2_INVULNERABLE);
  bVar1 = FName::operator==(&(this->super_APowerup).Mode.super_FName,NAME_None);
  if (bVar1) {
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar1) {
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      pMVar3 = AActor::GetClass(pAVar2);
      FNameNoInit::operator=
                (&(this->super_APowerup).Mode,
                 (FName *)&pMVar3[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType
                           .super_PCompoundType.super_PType.Conversions);
    }
  }
  bVar1 = FName::operator==(&(this->super_APowerup).Mode.super_FName,NAME_Reflective);
  if (bVar1) {
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag2,_unsigned_int>::operator|=(&pAVar2->flags2,MF2_REFLECTIVE);
  }
  return;
}

Assistant:

void APowerInvulnerable::InitEffect ()
{
	Super::InitEffect();
	Owner->effects &= ~FX_RESPAWNINVUL;
	Owner->flags2 |= MF2_INVULNERABLE;
	if (Mode == NAME_None && Owner->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{
		Mode = static_cast<PClassPlayerPawn *>(Owner->GetClass())->InvulMode;
	}
	if (Mode == NAME_Reflective)
	{
		Owner->flags2 |= MF2_REFLECTIVE;
	}
}